

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_column_data_scan.cpp
# Opt level: O1

unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true> __thiscall
duckdb::PhysicalColumnDataScan::GetLocalSourceState
          (PhysicalColumnDataScan *this,ExecutionContext *param_1,GlobalSourceState *param_2)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x58);
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[10] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR__PhysicalColumnDataLocalScanState_024a8c78;
  pp_Var1[1] = (_func_int *)(pp_Var1 + 7);
  pp_Var1[2] = (_func_int *)0x1;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var1 + 5) = 0x3f800000;
  *(undefined1 *)(pp_Var1 + 8) = 0;
  pp_Var1[9] = (_func_int *)0xffffffffffffffff;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = pp_Var1;
  return (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)
         (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)this;
}

Assistant:

unique_ptr<LocalSourceState> PhysicalColumnDataScan::GetLocalSourceState(ExecutionContext &,
                                                                         GlobalSourceState &) const {
	return make_uniq<PhysicalColumnDataLocalScanState>();
}